

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# card.h
# Opt level: O0

card * __thiscall card::getName_abi_cxx11_(card *this)

{
  long in_RSI;
  card *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 0x10));
  return this;
}

Assistant:

string card::getName() const { return name; }